

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O3

void crnlib::dxt_fast::compress_alpha_block
               (dxt5_block *pDXT5_block,color_quad_u8 *pBlock,uint comp_index)

{
  uint i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint8 *puVar4;
  uint uVar5;
  uint high8;
  uint low8;
  uint8 selectors [16];
  uint8 local_30 [4];
  uint8 local_2c [4];
  byte local_28 [16];
  
  compress_alpha_block(0x10,pBlock,(uint *)local_2c,(uint *)local_30,local_28,comp_index);
  pDXT5_block->m_endpoints[0] = local_2c[0];
  pDXT5_block->m_endpoints[1] = local_30[0];
  puVar4 = pDXT5_block->m_selectors;
  lVar1 = 0;
  uVar3 = 0;
  uVar2 = 0;
  do {
    uVar3 = (uint)local_28[lVar1] << ((byte)uVar2 & 0x1f) | uVar3;
    uVar5 = uVar2 + 3;
    if (7 < uVar5) {
      *puVar4 = (uint8)uVar3;
      puVar4 = puVar4 + 1;
      uVar3 = uVar3 >> 8;
      uVar5 = uVar2 - 5;
    }
    lVar1 = lVar1 + 1;
    uVar2 = uVar5;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void compress_alpha_block(dxt5_block* pDXT5_block, const color_quad_u8* pBlock, uint comp_index)
        {
            uint8 selectors[16];
            uint low8, high8;

            compress_alpha_block(16, pBlock, low8, high8, selectors, comp_index);

            pDXT5_block->set_low_alpha(low8);
            pDXT5_block->set_high_alpha(high8);

            uint mask = 0;
            uint bits = 0;
            uint8* pDst = pDXT5_block->m_selectors;

            for (uint i = 0; i < 16; i++)
            {
                mask |= (selectors[i] << bits);

                if ((bits += 3) >= 8)
                {
                    *pDst++ = static_cast<uint8>(mask);
                    mask >>= 8;
                    bits -= 8;
                }
            }
        }